

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx
          (FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this,int i)

{
  Fad<Fad<double>_> *this_00;
  undefined8 *in_RSI;
  value_type *in_RDI;
  value_type *pvVar1;
  Fad<Fad<double>_> *in_stack_ffffffffffffff70;
  Fad<double> *in_stack_ffffffffffffff90;
  Fad<double> *in_stack_ffffffffffffff98;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  Fad<double> *in_stack_ffffffffffffffb0;
  
  pvVar1 = in_RDI;
  this_00 = (Fad<Fad<double>_> *)
            Fad<Fad<double>_>::dx(in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)in_RSI[1]);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Fad<Fad<double>_>::dx(this_00,(int)((ulong)pvVar1 >> 0x20));
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)*in_RSI);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  operator-<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff98,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff90);
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)in_RSI[1]);
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)in_RSI[1]);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  operator/<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffff98,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff90);
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_RDI);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_RDI);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
  return pvVar1;
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}